

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack4to1.h
# Opt level: O3

void ncnn::conv3x3s1_winograd63_pack4to1_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int _c;
  int _c_00;
  undefined4 uVar6;
  size_t sVar7;
  int *piVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  Option *opt_00;
  Mat *dst;
  int iVar23;
  int iVar24;
  Option *opt_01;
  long lVar25;
  long lVar26;
  Option *opt_02;
  long lVar27;
  _func_int ***ppp_Var28;
  _func_int ***ppp_Var29;
  uint _w;
  int iVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  _func_int ***ppp_Var34;
  _func_int ***ppp_Var35;
  undefined1 (*pauVar36) [16];
  _func_int ***ppp_Var37;
  int iVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 (*pauVar42) [16];
  void *pvVar43;
  float *pfVar44;
  uint uVar45;
  uint uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  undefined1 auVar68 [16];
  undefined1 auVar69 [64];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  Mat local_1b8;
  Option *local_170;
  size_t local_168;
  ulong local_160;
  long local_158;
  int local_150;
  int local_14c;
  undefined1 local_148 [40];
  int iStack_120;
  int iStack_11c;
  int iStack_118;
  undefined8 uStack_114;
  size_t local_108;
  Mat *local_100;
  undefined1 local_f8 [64];
  size_t local_b8;
  Mat local_a8;
  Mat *local_58;
  Mat *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  _c = bottom_blob->c;
  sVar7 = bottom_blob->elemsize;
  iVar30 = bottom_blob->elempack;
  iVar32 = top_blob->w;
  iVar38 = top_blob->h;
  _c_00 = top_blob->c;
  opt_01 = (Option *)(long)_c_00;
  piVar8 = bottom_blob->refcount;
  local_a8.data = bottom_blob->data;
  local_a8.refcount._0_4_ = (int)bottom_blob->refcount;
  local_a8.refcount._4_4_ = (int)((ulong)bottom_blob->refcount >> 0x20);
  local_a8.allocator = bottom_blob->allocator;
  iVar24 = bottom_blob->h;
  iVar23 = bottom_blob->w;
  uVar17 = bottom_blob->dims;
  uVar18 = bottom_blob->w;
  local_a8.h = bottom_blob->h;
  local_a8.d = bottom_blob->d;
  local_a8.cstep = bottom_blob->cstep;
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + 1;
    UNLOCK();
    iVar23 = bottom_blob->w;
    iVar24 = bottom_blob->h;
  }
  iVar32 = (iVar32 + 5) / 6;
  local_150 = iVar32 * 6;
  iVar38 = (iVar38 + 5) / 6;
  local_14c = iVar38 * 6;
  local_170 = opt;
  local_100 = kernel_tm;
  local_a8.elemsize = sVar7;
  local_a8.elempack = iVar30;
  local_a8.dims = uVar17;
  local_a8.w = uVar18;
  local_a8.c = _c;
  local_58 = bias;
  local_50 = top_blob;
  copy_make_border(bottom_blob,&local_a8,0,(local_14c - iVar24) + 2,0,(local_150 - iVar23) + 2,0,0.0
                   ,opt);
  local_108 = 0;
  _w = iVar32 * iVar38 * 8 >> 3;
  local_148._0_8_ = (void *)0x0;
  local_148._8_4_ = 0;
  local_148._12_4_ = 0;
  local_148._16_4_ = 0;
  local_148._20_8_ = 0;
  local_148._32_8_ = (Allocator *)0x0;
  iStack_120 = 0;
  iStack_11c = 0;
  iStack_118 = 0;
  uStack_114._0_4_ = 0;
  uStack_114._4_4_ = 0;
  Mat::create((Mat *)local_148,_w,0x40,_c,sVar7,iVar30,opt->workspace_allocator);
  conv3x3s1_winograd63_transform_input_pack4_sse(&local_a8,(Mat *)local_148,opt_02);
  piVar8 = (int *)CONCAT44(local_a8.refcount._4_4_,(int)local_a8.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if (local_a8.data != (void *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_a8.cstep = 0;
  local_1b8.data = (Allocator *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_a8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_1b8.elempack = 0;
  local_b8 = 0;
  local_f8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  local_1b8.cstep = 0;
  local_1b8.elemsize._0_4_ = 0;
  if ((int)_w < 8) {
    uVar46 = _w;
    iVar32 = _c;
    if (3 < (int)_w) {
      iVar32 = _c * 4;
      uVar46 = (_w & 3) + 1;
    }
  }
  else {
    uVar46 = (_w & 3) + (_w >> 3) + (uint)((_w >> 2 & 1) != 0);
    iVar32 = _c * 8;
  }
  local_1b8.elemsize._4_4_ = (int)local_1b8.refcount;
  local_1b8.allocator = (Allocator *)local_1b8.data;
  local_1b8.dims = (int)local_1b8.refcount;
  local_1b8.w = local_1b8.refcount._4_4_;
  local_1b8.h = (int)local_1b8.elemsize;
  local_1b8.d = (int)local_1b8.refcount;
  local_1b8.c = local_1b8.elempack;
  local_f8._0_8_ = local_1b8.data;
  local_f8._8_4_ = (int)local_1b8.refcount;
  local_f8._12_4_ = local_1b8.refcount._4_4_;
  local_f8._16_8_ = local_a8.elemsize;
  local_f8._24_4_ = local_1b8.elempack;
  local_f8._32_8_ = local_1b8.data;
  local_f8._40_4_ = (int)local_1b8.refcount;
  local_f8._44_4_ = local_1b8.refcount._4_4_;
  local_a8.data = local_1b8.data;
  local_a8.refcount._0_4_ = (int)local_1b8.refcount;
  local_a8.refcount._4_4_ = local_1b8.refcount._4_4_;
  local_a8.elempack = local_1b8.elempack;
  local_a8.allocator = (Allocator *)local_1b8.data;
  local_a8.dims = (int)local_1b8.refcount;
  local_a8.w = local_1b8.elempack;
  local_a8._48_8_ = local_a8.elemsize;
  local_a8.c = local_1b8.elempack;
  Mat::create(&local_1b8,iVar32,uVar46,0x40,sVar7,iVar30,local_170->workspace_allocator);
  lVar25 = (long)(int)_w;
  lVar26 = 0;
  do {
    lVar31 = CONCAT44(local_1b8.elemsize._4_4_,(int)local_1b8.elemsize);
    lVar27 = local_1b8.cstep * lVar26 * lVar31;
    lVar33 = (long)local_1b8.w;
    uVar41 = 0;
    if (7 < (int)_w) {
      uVar40 = 0;
      do {
        if (0 < _c) {
          pauVar42 = (undefined1 (*) [16])
                     ((ulong)((_w * (int)lVar26 + (int)uVar40) * 4) * 4 + local_148._0_8_);
          pauVar36 = (undefined1 (*) [16])
                     ((long)(_func_int ***)local_1b8.data + (uVar40 >> 3) * lVar31 * lVar33 + lVar27
                     );
          iVar30 = _c;
          do {
            auVar54 = vunpcklps_avx(*pauVar42,pauVar42[1]);
            auVar64 = vunpcklps_avx(pauVar42[2],pauVar42[3]);
            auVar58 = vunpckhps_avx(*pauVar42,pauVar42[1]);
            auVar61 = vunpckhps_avx(pauVar42[2],pauVar42[3]);
            auVar47 = vmovlhps_avx(auVar54,auVar64);
            auVar64 = vunpckhpd_avx(auVar54,auVar64);
            auVar54 = vmovlhps_avx(auVar58,auVar61);
            auVar66 = vunpckhpd_avx(auVar58,auVar61);
            auVar61 = vunpcklps_avx(pauVar42[4],pauVar42[5]);
            auVar68 = vunpcklps_avx(pauVar42[6],pauVar42[7]);
            auVar70 = vunpckhps_avx(pauVar42[4],pauVar42[5]);
            auVar48 = vunpckhps_avx(pauVar42[6],pauVar42[7]);
            auVar58 = vmovlhps_avx(auVar61,auVar68);
            auVar68 = vunpckhpd_avx(auVar61,auVar68);
            auVar61 = vmovlhps_avx(auVar70,auVar48);
            auVar70 = vunpckhpd_avx(auVar70,auVar48);
            *pauVar36 = auVar47;
            pauVar36[1] = auVar58;
            pauVar36[2] = auVar64;
            pauVar36[3] = auVar68;
            pauVar36[4] = auVar54;
            pauVar36[5] = auVar61;
            pauVar36[6] = auVar66;
            pauVar36[7] = auVar70;
            pauVar42 = pauVar42 + local_108;
            pauVar36 = pauVar36 + 8;
            iVar30 = iVar30 + -1;
          } while (iVar30 != 0);
        }
        uVar41 = uVar40 + 8;
        lVar39 = uVar40 + 0xf;
        uVar40 = uVar41;
      } while (lVar39 < lVar25);
    }
    if ((int)((uint)uVar41 | 3) < (int)_w) {
      uVar40 = uVar41 & 0xffffffff;
      do {
        if (0 < _c) {
          pauVar42 = (undefined1 (*) [16])((uVar40 + lVar26 * lVar25) * 0x10 + local_148._0_8_);
          pauVar36 = (undefined1 (*) [16])
                     ((long)(_func_int ***)local_1b8.data +
                     (ulong)(((uint)(uVar40 >> 3) & 0x1fffffff) +
                            (uint)(((uint)uVar40 >> 2 & 1) != 0)) * lVar31 * lVar33 + lVar27);
          iVar30 = _c;
          do {
            auVar54 = vunpcklps_avx(*pauVar42,pauVar42[1]);
            auVar58 = vunpcklps_avx(pauVar42[2],pauVar42[3]);
            auVar61 = vunpckhps_avx(*pauVar42,pauVar42[1]);
            auVar64 = vunpckhps_avx(pauVar42[2],pauVar42[3]);
            auVar47 = vmovlhps_avx(auVar54,auVar58);
            auVar58 = vunpckhpd_avx(auVar54,auVar58);
            auVar54 = vmovlhps_avx(auVar61,auVar64);
            auVar61 = vunpckhpd_avx(auVar61,auVar64);
            *pauVar36 = auVar47;
            pauVar36[1] = auVar58;
            pauVar36[2] = auVar54;
            pauVar36[3] = auVar61;
            pauVar42 = pauVar42 + local_108;
            pauVar36 = pauVar36 + 4;
            iVar30 = iVar30 + -1;
          } while (iVar30 != 0);
        }
        uVar41 = uVar40 + 4;
        lVar39 = uVar40 + 7;
        uVar40 = uVar41;
      } while (lVar39 < lVar25);
    }
    if ((int)uVar41 < (int)_w) {
      uVar41 = uVar41 & 0xffffffff;
      do {
        if (0 < _c) {
          pauVar36 = (undefined1 (*) [16])((uVar41 + lVar26 * lVar25) * 0x10 + local_148._0_8_);
          pauVar42 = (undefined1 (*) [16])
                     ((long)(_func_int ***)local_1b8.data +
                     (ulong)(((uint)(uVar41 >> 3) & 0x1fffffff) + ((uint)uVar41 & 3) +
                            (uint)(((uint)uVar41 >> 2 & 1) != 0)) * lVar31 * lVar33 + lVar27);
          iVar30 = _c;
          do {
            *pauVar42 = *pauVar36;
            pauVar36 = pauVar36 + local_108;
            pauVar42 = pauVar42 + 1;
            iVar30 = iVar30 + -1;
          } while (iVar30 != 0);
        }
        uVar41 = uVar41 + 1;
      } while (uVar41 != _w);
    }
    lVar26 = lVar26 + 1;
  } while (lVar26 != 0x40);
  piVar8 = (int *)CONCAT44(local_148._12_4_,local_148._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_148._32_8_ == (Allocator *)0x0) {
        if ((void *)local_148._0_8_ != (void *)0x0) {
          free((void *)local_148._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_148._32_8_)[3])();
      }
    }
  }
  local_108 = 0;
  local_148._0_8_ = (Allocator *)0x0;
  local_148._8_4_ = 0;
  local_148._12_4_ = 0;
  local_148._16_4_ = 0;
  local_148._20_8_ = 0;
  iStack_11c = 0;
  local_148._32_8_ = local_148._0_8_;
  iStack_120 = local_148._8_4_;
  iStack_118 = local_148._16_4_;
  uStack_114 = local_148._20_8_;
  Mat::create((Mat *)local_f8,_w,0x40,_c_00,4,1,local_170->workspace_allocator);
  dst = local_50;
  iVar30 = local_14c;
  opt_00 = local_170;
  if (0 < _c_00 >> 2) {
    iVar32 = 1;
    if (1 < _c * 4) {
      iVar32 = _c * 4;
    }
    local_48 = (ulong)(uint)(_c_00 >> 2);
    uVar41 = 0;
    do {
      local_40 = uVar41;
      ppp_Var29 = (_func_int ***)
                  ((long)(_func_int ***)local_f8._0_8_ + local_40 * 4 * local_b8 * local_f8._16_8_);
      ppp_Var34 = (_func_int ***)
                  ((long)(_func_int ***)local_f8._0_8_ +
                  (local_40 * 4 + 1) * local_b8 * local_f8._16_8_);
      ppp_Var35 = (_func_int ***)
                  ((long)(_func_int ***)local_f8._0_8_ +
                  (local_40 * 4 + 2) * local_b8 * local_f8._16_8_);
      ppp_Var37 = (_func_int ***)
                  ((long)(_func_int ***)local_f8._0_8_ +
                  (local_40 * 4 + 3) * local_b8 * local_f8._16_8_);
      local_38 = (long)local_100->w * local_100->elemsize;
      pvVar43 = (void *)(local_100->elemsize * local_100->cstep * local_40 + (long)local_100->data);
      lVar26 = 0;
      do {
        local_158 = lVar26;
        uVar41 = 0;
        local_160 = (ulong)local_1b8.w;
        lVar26 = CONCAT44(local_1b8.elemsize._4_4_,(int)local_1b8.elemsize);
        local_168 = local_1b8.cstep;
        if (7 < (int)_w) {
          ppp_Var28 = (_func_int ***)
                      ((long)(_func_int ***)local_1b8.data + local_1b8.cstep * lVar26 * local_158);
          uVar40 = 0;
          do {
            if (_c < 1) {
              auVar70 = SUB6416(ZEXT864(0),0);
              auVar68 = SUB6416(ZEXT864(0),0);
              auVar66 = SUB6416(ZEXT864(0),0);
              auVar64 = SUB6416(ZEXT864(0),0);
              auVar58 = SUB6416(ZEXT864(0),0);
              auVar54 = SUB6416(ZEXT864(0),0);
              auVar47 = SUB6416(ZEXT864(0),0);
              auVar61 = SUB6416(ZEXT864(0),0);
            }
            else {
              auVar63 = ZEXT864(0);
              lVar31 = 0;
              auVar53 = ZEXT864(0);
              auVar57 = ZEXT864(0);
              auVar60 = ZEXT864(0);
              auVar65 = ZEXT864(0);
              auVar67 = ZEXT864(0);
              auVar69 = ZEXT864(0);
              auVar71 = ZEXT864(0);
              iVar38 = iVar32;
              do {
                pfVar44 = (float *)((long)ppp_Var28 + lVar31 * 2);
                fVar13 = *pfVar44;
                fVar14 = pfVar44[1];
                fVar15 = pfVar44[2];
                fVar16 = pfVar44[3];
                auVar47 = *(undefined1 (*) [16])((long)(ppp_Var28 + 2) + lVar31 * 2);
                fVar2 = *(float *)((long)pvVar43 + lVar31);
                fVar3 = *(float *)((long)pvVar43 + lVar31 + 4);
                fVar4 = *(float *)((long)pvVar43 + lVar31 + 8);
                fVar5 = *(float *)((long)pvVar43 + lVar31 + 0xc);
                auVar61._0_4_ = fVar2 * fVar13 + auVar63._0_4_;
                auVar61._4_4_ = fVar2 * fVar14 + auVar63._4_4_;
                auVar61._8_4_ = fVar2 * fVar15 + auVar63._8_4_;
                auVar61._12_4_ = fVar2 * fVar16 + auVar63._12_4_;
                auVar63 = ZEXT1664(auVar61);
                fVar9 = auVar47._0_4_;
                fVar10 = auVar47._4_4_;
                fVar11 = auVar47._8_4_;
                fVar12 = auVar47._12_4_;
                auVar70._0_4_ = fVar2 * fVar9 + auVar71._0_4_;
                auVar70._4_4_ = fVar2 * fVar10 + auVar71._4_4_;
                auVar70._8_4_ = fVar2 * fVar11 + auVar71._8_4_;
                auVar70._12_4_ = fVar2 * fVar12 + auVar71._12_4_;
                auVar71 = ZEXT1664(auVar70);
                auVar68._0_4_ = fVar3 * fVar13 + auVar69._0_4_;
                auVar68._4_4_ = fVar3 * fVar14 + auVar69._4_4_;
                auVar68._8_4_ = fVar3 * fVar15 + auVar69._8_4_;
                auVar68._12_4_ = fVar3 * fVar16 + auVar69._12_4_;
                auVar69 = ZEXT1664(auVar68);
                auVar66._0_4_ = fVar3 * fVar9 + auVar67._0_4_;
                auVar66._4_4_ = fVar3 * fVar10 + auVar67._4_4_;
                auVar66._8_4_ = fVar3 * fVar11 + auVar67._8_4_;
                auVar66._12_4_ = fVar3 * fVar12 + auVar67._12_4_;
                auVar67 = ZEXT1664(auVar66);
                auVar64._0_4_ = fVar4 * fVar13 + auVar65._0_4_;
                auVar64._4_4_ = fVar4 * fVar14 + auVar65._4_4_;
                auVar64._8_4_ = fVar4 * fVar15 + auVar65._8_4_;
                auVar64._12_4_ = fVar4 * fVar16 + auVar65._12_4_;
                auVar65 = ZEXT1664(auVar64);
                auVar58._0_4_ = fVar4 * fVar9 + auVar60._0_4_;
                auVar58._4_4_ = fVar4 * fVar10 + auVar60._4_4_;
                auVar58._8_4_ = fVar4 * fVar11 + auVar60._8_4_;
                auVar58._12_4_ = fVar4 * fVar12 + auVar60._12_4_;
                auVar60 = ZEXT1664(auVar58);
                auVar54._0_4_ = fVar5 * fVar13 + auVar57._0_4_;
                auVar54._4_4_ = fVar5 * fVar14 + auVar57._4_4_;
                auVar54._8_4_ = fVar5 * fVar15 + auVar57._8_4_;
                auVar54._12_4_ = fVar5 * fVar16 + auVar57._12_4_;
                auVar57 = ZEXT1664(auVar54);
                auVar47._0_4_ = fVar5 * fVar9 + auVar53._0_4_;
                auVar47._4_4_ = fVar5 * fVar10 + auVar53._4_4_;
                auVar47._8_4_ = fVar5 * fVar11 + auVar53._8_4_;
                auVar47._12_4_ = fVar5 * fVar12 + auVar53._12_4_;
                auVar53 = ZEXT1664(auVar47);
                lVar31 = lVar31 + 0x10;
                iVar38 = iVar38 + -1;
              } while (iVar38 != 0);
            }
            *(undefined1 (*) [16])ppp_Var29 = auVar61;
            *(undefined1 (*) [16])(ppp_Var29 + 2) = auVar70;
            *(undefined1 (*) [16])ppp_Var34 = auVar68;
            *(undefined1 (*) [16])(ppp_Var34 + 2) = auVar66;
            *(undefined1 (*) [16])ppp_Var35 = auVar64;
            *(undefined1 (*) [16])(ppp_Var35 + 2) = auVar58;
            *(undefined1 (*) [16])ppp_Var37 = auVar54;
            *(undefined1 (*) [16])(ppp_Var37 + 2) = auVar47;
            ppp_Var29 = ppp_Var29 + 4;
            ppp_Var34 = ppp_Var34 + 4;
            ppp_Var35 = ppp_Var35 + 4;
            ppp_Var37 = ppp_Var37 + 4;
            uVar41 = uVar40 + 8;
            lVar31 = uVar40 + 0xf;
            ppp_Var28 = (_func_int ***)((long)ppp_Var28 + lVar26 * local_160);
            uVar40 = uVar41;
          } while (lVar31 < lVar25);
        }
        uVar46 = (uint)uVar41;
        if ((int)(uVar46 | 3) < (int)_w) {
          uVar45 = 0;
          do {
            iVar38 = (int)uVar41;
            if (_c < 1) {
              auVar62 = SUB6416(ZEXT864(0),0);
              auVar59 = SUB6416(ZEXT864(0),0);
              auVar55 = SUB6416(ZEXT864(0),0);
              auVar48 = SUB6416(ZEXT864(0),0);
            }
            else {
              auVar53 = ZEXT864(0);
              lVar31 = 0;
              auVar57 = ZEXT864(0);
              auVar60 = ZEXT864(0);
              auVar63 = ZEXT864(0);
              iVar24 = iVar32;
              do {
                pfVar44 = (float *)((long)(_func_int ***)local_1b8.data +
                                   lVar31 + (((uVar45 & 1) + ((uint)(uVar41 >> 3) & 0x1fffffff)) *
                                             local_160 + local_1b8.cstep * local_158) * lVar26);
                fVar9 = *pfVar44;
                fVar10 = pfVar44[1];
                fVar11 = pfVar44[2];
                fVar12 = pfVar44[3];
                fVar2 = *(float *)((long)pvVar43 + lVar31);
                fVar3 = *(float *)((long)pvVar43 + lVar31 + 4);
                fVar4 = *(float *)((long)pvVar43 + lVar31 + 8);
                fVar5 = *(float *)((long)pvVar43 + lVar31 + 0xc);
                auVar62._0_4_ = fVar2 * fVar9 + auVar63._0_4_;
                auVar62._4_4_ = fVar2 * fVar10 + auVar63._4_4_;
                auVar62._8_4_ = fVar2 * fVar11 + auVar63._8_4_;
                auVar62._12_4_ = fVar2 * fVar12 + auVar63._12_4_;
                auVar63 = ZEXT1664(auVar62);
                auVar59._0_4_ = fVar3 * fVar9 + auVar60._0_4_;
                auVar59._4_4_ = fVar3 * fVar10 + auVar60._4_4_;
                auVar59._8_4_ = fVar3 * fVar11 + auVar60._8_4_;
                auVar59._12_4_ = fVar3 * fVar12 + auVar60._12_4_;
                auVar60 = ZEXT1664(auVar59);
                auVar55._0_4_ = fVar4 * fVar9 + auVar57._0_4_;
                auVar55._4_4_ = fVar4 * fVar10 + auVar57._4_4_;
                auVar55._8_4_ = fVar4 * fVar11 + auVar57._8_4_;
                auVar55._12_4_ = fVar4 * fVar12 + auVar57._12_4_;
                auVar57 = ZEXT1664(auVar55);
                auVar48._0_4_ = fVar5 * fVar9 + auVar53._0_4_;
                auVar48._4_4_ = fVar5 * fVar10 + auVar53._4_4_;
                auVar48._8_4_ = fVar5 * fVar11 + auVar53._8_4_;
                auVar48._12_4_ = fVar5 * fVar12 + auVar53._12_4_;
                auVar53 = ZEXT1664(auVar48);
                lVar31 = lVar31 + 0x10;
                iVar24 = iVar24 + -1;
              } while (iVar24 != 0);
            }
            *(undefined1 (*) [16])ppp_Var29 = auVar62;
            *(undefined1 (*) [16])ppp_Var34 = auVar59;
            *(undefined1 (*) [16])ppp_Var35 = auVar55;
            *(undefined1 (*) [16])ppp_Var37 = auVar48;
            ppp_Var29 = ppp_Var29 + 2;
            ppp_Var34 = ppp_Var34 + 2;
            ppp_Var35 = ppp_Var35 + 2;
            ppp_Var37 = ppp_Var37 + 2;
            uVar46 = iVar38 + 4;
            uVar45 = (uint)(byte)((char)uVar45 + 1);
            uVar41 = (ulong)uVar46;
          } while (iVar38 + 7 < (int)_w);
        }
        if ((int)uVar46 < (int)_w) {
          local_168 = local_1b8.cstep * local_158;
          do {
            if (_c < 1) {
              auVar49 = SUB6416(ZEXT864(0),0);
            }
            else {
              auVar53 = ZEXT864(0);
              lVar31 = 0;
              iVar38 = iVar32;
              do {
                fVar2 = *(float *)((long)(_func_int ***)local_1b8.data +
                                  lVar31 + (((uVar46 & 3) + (uVar46 >> 3) +
                                            (uint)((uVar46 >> 2 & 1) != 0)) * local_160 + local_168)
                                           * lVar26);
                pfVar44 = (float *)((long)pvVar43 + lVar31 * 4);
                auVar49._0_4_ = fVar2 * *pfVar44 + auVar53._0_4_;
                auVar49._4_4_ = fVar2 * pfVar44[1] + auVar53._4_4_;
                auVar49._8_4_ = fVar2 * pfVar44[2] + auVar53._8_4_;
                auVar49._12_4_ = fVar2 * pfVar44[3] + auVar53._12_4_;
                auVar53 = ZEXT1664(auVar49);
                lVar31 = lVar31 + 4;
                iVar38 = iVar38 + -1;
              } while (iVar38 != 0);
            }
            *(int *)ppp_Var29 = auVar49._0_4_;
            uVar6 = vextractps_avx(auVar49,1);
            *(undefined4 *)ppp_Var34 = uVar6;
            uVar6 = vextractps_avx(auVar49,2);
            *(undefined4 *)ppp_Var35 = uVar6;
            uVar6 = vextractps_avx(auVar49,3);
            *(undefined4 *)ppp_Var37 = uVar6;
            ppp_Var29 = (_func_int ***)((long)ppp_Var29 + 4);
            ppp_Var34 = (_func_int ***)((long)ppp_Var34 + 4);
            ppp_Var35 = (_func_int ***)((long)ppp_Var35 + 4);
            ppp_Var37 = (_func_int ***)((long)ppp_Var37 + 4);
            uVar46 = uVar46 + 1;
          } while (uVar46 != _w);
        }
        pvVar43 = (void *)((long)pvVar43 + local_38);
        lVar26 = local_158 + 1;
      } while (local_158 + 1 != 0x40);
      uVar41 = local_40 + 1;
    } while (local_40 + 1 != local_48);
  }
  uVar41 = (ulong)opt_01 & 0xfffffffffffffffc;
  if ((int)uVar41 != _c_00) {
    iVar32 = 1;
    if (1 < _c * 4) {
      iVar32 = _c * 4;
    }
    do {
      local_160 = uVar41;
      ppp_Var29 = (_func_int ***)
                  ((long)(_func_int ***)local_f8._0_8_ + local_b8 * local_160 * local_f8._16_8_);
      uVar46 = (uint)local_160;
      uVar45 = uVar46 + 3;
      if (-1 < (int)uVar46) {
        uVar45 = uVar46;
      }
      iVar38 = local_100->w;
      sVar7 = local_100->elemsize;
      pvVar43 = (void *)((long)(int)(((int)uVar45 >> 2) + (uVar46 - (uVar45 & 0xfffffffc))) *
                         local_100->cstep * sVar7 + (long)local_100->data);
      lVar26 = 0;
      do {
        lVar31 = CONCAT44(local_1b8.elemsize._4_4_,(int)local_1b8.elemsize);
        lVar33 = local_1b8.cstep * lVar26 * lVar31;
        uVar41 = 0;
        lVar27 = (long)local_1b8.w;
        if (7 < (int)_w) {
          uVar40 = 0;
          do {
            if (_c < 1) {
              auVar56 = SUB6416(ZEXT864(0),0);
              auVar50 = SUB6416(ZEXT864(0),0);
            }
            else {
              pfVar44 = (float *)((long)(_func_int ***)local_1b8.data +
                                 (uVar40 >> 3) * lVar31 * lVar27 + lVar33);
              auVar53 = ZEXT864(0);
              lVar39 = 0;
              auVar57 = ZEXT864(0);
              do {
                fVar2 = *(float *)((long)pvVar43 + lVar39 * 4);
                auVar56._0_4_ = fVar2 * *pfVar44 + auVar57._0_4_;
                auVar56._4_4_ = fVar2 * pfVar44[1] + auVar57._4_4_;
                auVar56._8_4_ = fVar2 * pfVar44[2] + auVar57._8_4_;
                auVar56._12_4_ = fVar2 * pfVar44[3] + auVar57._12_4_;
                auVar57 = ZEXT1664(auVar56);
                auVar50._0_4_ = fVar2 * pfVar44[4] + auVar53._0_4_;
                auVar50._4_4_ = fVar2 * pfVar44[5] + auVar53._4_4_;
                auVar50._8_4_ = fVar2 * pfVar44[6] + auVar53._8_4_;
                auVar50._12_4_ = fVar2 * pfVar44[7] + auVar53._12_4_;
                auVar53 = ZEXT1664(auVar50);
                lVar39 = lVar39 + 1;
                pfVar44 = pfVar44 + 8;
              } while (iVar32 != (int)lVar39);
            }
            *(undefined1 (*) [16])ppp_Var29 = auVar56;
            *(undefined1 (*) [16])(ppp_Var29 + 2) = auVar50;
            ppp_Var29 = ppp_Var29 + 4;
            uVar41 = uVar40 + 8;
            lVar39 = uVar40 + 0xf;
            uVar40 = uVar41;
          } while (lVar39 < lVar25);
        }
        uVar46 = (uint)uVar41;
        if ((int)(uVar46 | 3) < (int)_w) {
          do {
            uVar45 = (uint)uVar41;
            if (_c < 1) {
              auVar51 = SUB6416(ZEXT864(0),0);
            }
            else {
              pfVar44 = (float *)((long)(_func_int ***)local_1b8.data +
                                 (ulong)(((uint)(uVar41 >> 3) & 0x1fffffff) +
                                        (uint)((uVar45 >> 2 & 1) != 0)) * lVar31 * lVar27 + lVar33);
              auVar53 = ZEXT864(0);
              lVar39 = 0;
              do {
                fVar2 = *(float *)((long)pvVar43 + lVar39 * 4);
                auVar51._0_4_ = fVar2 * *pfVar44 + auVar53._0_4_;
                auVar51._4_4_ = fVar2 * pfVar44[1] + auVar53._4_4_;
                auVar51._8_4_ = fVar2 * pfVar44[2] + auVar53._8_4_;
                auVar51._12_4_ = fVar2 * pfVar44[3] + auVar53._12_4_;
                auVar53 = ZEXT1664(auVar51);
                pfVar44 = pfVar44 + 4;
                lVar39 = lVar39 + 1;
              } while (iVar32 != (int)lVar39);
            }
            *(undefined1 (*) [16])ppp_Var29 = auVar51;
            ppp_Var29 = ppp_Var29 + 2;
            uVar46 = uVar45 + 4;
            uVar41 = (ulong)uVar46;
          } while ((int)(uVar45 + 7) < (int)_w);
        }
        if ((int)uVar46 < (int)_w) {
          do {
            if (_c < 1) {
              auVar52 = ZEXT816(0);
            }
            else {
              lVar33 = 0;
              iVar24 = _c;
              auVar47 = ZEXT816(0);
              do {
                pfVar44 = (float *)((long)pvVar43 + lVar33);
                pfVar1 = (float *)((long)(_func_int ***)local_1b8.data +
                                  lVar33 + ((ulong)((uVar46 & 3) + (uVar46 >> 3) +
                                                   (uint)((uVar46 >> 2 & 1) != 0)) * lVar27 +
                                           local_1b8.cstep * lVar26) * lVar31);
                auVar52._0_4_ = *pfVar44 * *pfVar1 + auVar47._0_4_;
                auVar52._4_4_ = pfVar44[1] * pfVar1[1] + auVar47._4_4_;
                auVar52._8_4_ = pfVar44[2] * pfVar1[2] + auVar47._8_4_;
                auVar52._12_4_ = pfVar44[3] * pfVar1[3] + auVar47._12_4_;
                lVar33 = lVar33 + 0x10;
                iVar24 = iVar24 + -1;
                auVar47 = auVar52;
              } while (iVar24 != 0);
            }
            auVar47 = vhaddps_avx(auVar52,auVar52);
            auVar47 = vhaddps_avx(auVar47,auVar47);
            *(int *)ppp_Var29 = auVar47._0_4_;
            ppp_Var29 = (_func_int ***)((long)ppp_Var29 + 4);
            uVar46 = uVar46 + 1;
          } while (uVar46 != _w);
        }
        lVar26 = lVar26 + 1;
        pvVar43 = (void *)((long)pvVar43 + (long)iVar38 * sVar7);
      } while (lVar26 != 0x40);
      uVar41 = local_160 + 1;
    } while ((long)(local_160 + 1) < (long)opt_01);
  }
  piVar8 = (int *)CONCAT44(local_1b8.refcount._4_4_,(int)local_1b8.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_1b8.data != (Allocator *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar8 = (int *)CONCAT44(local_148._12_4_,local_148._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_148._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_148._0_8_ != (Allocator *)0x0) {
          free((void *)local_148._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_148._32_8_)[3])();
      }
    }
  }
  local_108 = 0;
  local_148._0_8_ = (void *)0x0;
  local_148._8_4_ = 0;
  local_148._12_4_ = 0;
  local_148._16_4_ = 0;
  local_148._20_8_ = 0;
  iStack_118 = 0;
  uStack_114._0_4_ = 0;
  uStack_114._4_4_ = 0;
  local_148._32_8_ = (Allocator *)0x0;
  iStack_120 = 0;
  iStack_11c = 0;
  local_1b8.cstep = 0;
  local_1b8.data = (void *)0x0;
  local_1b8.refcount._0_4_ = 0;
  local_1b8.refcount._4_4_ = 0;
  local_1b8.elemsize._0_4_ = 0;
  local_1b8.elemsize._4_4_ = 0;
  local_1b8.elempack = 0;
  local_1b8.allocator = (Allocator *)0x0;
  local_1b8.dims = 0;
  local_1b8.w = 0;
  local_1b8.h = 0;
  local_1b8.d = 0;
  local_1b8.c = 0;
  if ((local_150 == dst->w) && (iVar30 == dst->h)) {
    opt_01 = (Option *)(local_148 + 0x20);
    if (&local_1b8 != dst) {
      piVar8 = dst->refcount;
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + 1;
        UNLOCK();
      }
      local_1b8.data = dst->data;
      local_1b8.refcount._0_4_ = (int)dst->refcount;
      local_1b8.refcount._4_4_ = (int)((ulong)dst->refcount >> 0x20);
      local_1b8.elemsize._0_4_ = (int)dst->elemsize;
      local_1b8.elemsize._4_4_ = (int)(dst->elemsize >> 0x20);
      local_1b8.elempack = dst->elempack;
      local_1b8.allocator = dst->allocator;
      uVar19 = dst->dims;
      uVar20 = dst->w;
      uVar21 = dst->h;
      uVar22 = dst->d;
      local_1b8.c = dst->c;
      local_1b8.cstep = dst->cstep;
      local_1b8.dims = uVar19;
      local_1b8.w = uVar20;
      local_1b8.h = uVar21;
      local_1b8.d = uVar22;
    }
  }
  else {
    Mat::create(&local_1b8,local_150,iVar30,_c_00,4,1,opt_00->workspace_allocator);
  }
  conv3x3s1_winograd63_transform_output_sse((Mat *)local_f8,&local_1b8,(Mat *)local_58->data,opt_01)
  ;
  copy_cut_border(&local_1b8,dst,0,local_1b8.h - dst->h,0,local_1b8.w - dst->w,opt_00);
  piVar8 = (int *)CONCAT44(local_1b8.refcount._4_4_,(int)local_1b8.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_1b8.allocator == (Allocator *)0x0) {
        if (local_1b8.data != (void *)0x0) {
          free(local_1b8.data);
        }
      }
      else {
        (*(local_1b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar8 = (int *)CONCAT44(local_f8._12_4_,local_f8._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_f8._32_8_ == (Allocator *)0x0) {
        if ((Allocator *)local_f8._0_8_ != (Allocator *)0x0) {
          free((void *)local_f8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_f8._32_8_)[3])();
      }
    }
  }
  piVar8 = (int *)CONCAT44(local_148._12_4_,local_148._8_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if ((Allocator *)local_148._32_8_ == (Allocator *)0x0) {
        if ((void *)local_148._0_8_ != (void *)0x0) {
          free((void *)local_148._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_148._32_8_)[3])();
      }
    }
  }
  piVar8 = (int *)CONCAT44(local_a8.refcount._4_4_,(int)local_a8.refcount);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_a8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_a8.data != (Allocator *)0x0) {
          free(local_a8.data);
        }
      }
      else {
        (*(local_a8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_pack4to1_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 6n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 5) / 6 * 6;
    outh = (outh + 5) / 6 * 6;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 6 * 8;
        int h_tm = outh / 6 * 8;

        const int tiles = w_tm / 8 * h_tm / 8;

        bottom_blob_tm.create(tiles, 64, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd63_transform_input_pack4_sse(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 6 * 8;
        int h_tm = outh / 6 * 8;

        const int tiles = h_tm / 8 * w_tm / 8;

        // permute
        //         bottom_blob_tm.create(tiles, 64, inch, elemsize, elempack, opt.workspace_allocator);
        Mat bottom_blob_tm2;
        if (tiles >= 8)
            bottom_blob_tm2.create(8 * inch, tiles / 8 + (tiles % 8) / 4 + tiles % 4, 64, elemsize, elempack, opt.workspace_allocator);
        else if (tiles >= 4)
            bottom_blob_tm2.create(4 * inch, tiles / 4 + tiles % 4, 64, elemsize, elempack, opt.workspace_allocator);
        else // if (tiles >= 1)
            bottom_blob_tm2.create(1 * inch, tiles, 64, elemsize, elempack, opt.workspace_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int r = 0; r < 64; r++)
        {
            Mat tm2 = bottom_blob_tm2.channel(r);

            // tile
            int i = 0;
            for (; i + 7 < tiles; i += 8)
            {
                float* tmpptr = tm2.row(i / 8);

                const float* r0 = bottom_blob_tm;

                r0 += (r * tiles + i) * 4;

                for (int q = 0; q < inch; q++)
                {
                    // transpose 4x8
                    __m128 _r0 = _mm_load_ps(r0);
                    __m128 _r1 = _mm_load_ps(r0 + 4);
                    __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(r0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(r0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(r0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(r0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(r0 + 4 * 7);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r1);
                    _mm_store_ps(tmpptr + 4 * 3, _r5);
                    _mm_store_ps(tmpptr + 4 * 4, _r2);
                    _mm_store_ps(tmpptr + 4 * 5, _r6);
                    _mm_store_ps(tmpptr + 4 * 6, _r3);
                    _mm_store_ps(tmpptr + 4 * 7, _r7);

                    r0 += bottom_blob_tm.cstep * 4;
                    tmpptr += 32;
                }
            }
            for (; i + 3 < tiles; i += 4)
            {
                float* tmpptr = tm2.row(i / 8 + (i % 8) / 4);

                const float* r0 = bottom_blob_tm;

                r0 += (r * tiles + i) * 4;

                for (int q = 0; q < inch; q++)
                {
                    // transpose 4x4
                    __m128 _r0 = _mm_load_ps(r0);
                    __m128 _r1 = _mm_load_ps(r0 + 4);
                    __m128 _r2 = _mm_load_ps(r0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(r0 + 4 * 3);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r1);
                    _mm_store_ps(tmpptr + 4 * 2, _r2);
                    _mm_store_ps(tmpptr + 4 * 3, _r3);

                    r0 += bottom_blob_tm.cstep * 4;
                    tmpptr += 16;
                }
            }
            for (; i < tiles; i++)
            {
                float* tmpptr = tm2.row(i / 8 + (i % 8) / 4 + i % 4);

                const float* r0 = bottom_blob_tm;

                r0 += (r * tiles + i) * 4;

                for (int q = 0; q < inch; q++)
                {
                    __m128 _val = _mm_load_ps(r0);
                    _mm_store_ps(tmpptr, _val);

                    r0 += bottom_blob_tm.cstep * 4;
                    tmpptr += 4;
                }
            }
        }

        bottom_blob_tm = Mat();
        // permute end

        top_blob_tm.create(tiles, 64, outch, 4u, 1, opt.workspace_allocator);

        int nn_outch = outch >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < nn_outch; pp++)
        {
            int p = pp * 4;

            float* output0_tm = top_blob_tm.channel(p);
            float* output1_tm = top_blob_tm.channel(p + 1);
            float* output2_tm = top_blob_tm.channel(p + 2);
            float* output3_tm = top_blob_tm.channel(p + 3);

            const Mat kernel01_tm = kernel_tm.channel(p / 4);

            for (int r = 0; r < 64; r++)
            {
                const Mat bb2 = bottom_blob_tm2.channel(r);

                int i = 0;
                for (; i + 7 < tiles; i += 8)
                {
                    const float* r0 = bb2.row(i / 8);

                    const float* kptr = kernel01_tm.row(r);

                    int nn = inch * 4; // inch always > 0

                    __m128 _sum0 = _mm_setzero_ps();
                    __m128 _sum1 = _mm_setzero_ps();
                    __m128 _sum2 = _mm_setzero_ps();
                    __m128 _sum3 = _mm_setzero_ps();
                    __m128 _sum4 = _mm_setzero_ps();
                    __m128 _sum5 = _mm_setzero_ps();
                    __m128 _sum6 = _mm_setzero_ps();
                    __m128 _sum7 = _mm_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m128 _val0 = _mm_load_ps(r0);
                        __m128 _val1 = _mm_load_ps(r0 + 4);

                        __m128 _w0 = _mm_load1_ps(kptr);
                        __m128 _w1 = _mm_load1_ps(kptr + 1);
                        __m128 _w2 = _mm_load1_ps(kptr + 2);
                        __m128 _w3 = _mm_load1_ps(kptr + 3);

                        _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                        _sum1 = _mm_comp_fmadd_ps(_val1, _w0, _sum1);
                        _sum2 = _mm_comp_fmadd_ps(_val0, _w1, _sum2);
                        _sum3 = _mm_comp_fmadd_ps(_val1, _w1, _sum3);
                        _sum4 = _mm_comp_fmadd_ps(_val0, _w2, _sum4);
                        _sum5 = _mm_comp_fmadd_ps(_val1, _w2, _sum5);
                        _sum6 = _mm_comp_fmadd_ps(_val0, _w3, _sum6);
                        _sum7 = _mm_comp_fmadd_ps(_val1, _w3, _sum7);

                        r0 += 8;
                        kptr += 4;
                    }

                    _mm_storeu_ps(output0_tm, _sum0);
                    _mm_storeu_ps(output0_tm + 4, _sum1);
                    _mm_storeu_ps(output1_tm, _sum2);
                    _mm_storeu_ps(output1_tm + 4, _sum3);
                    _mm_storeu_ps(output2_tm, _sum4);
                    _mm_storeu_ps(output2_tm + 4, _sum5);
                    _mm_storeu_ps(output3_tm, _sum6);
                    _mm_storeu_ps(output3_tm + 4, _sum7);

                    output0_tm += 8;
                    output1_tm += 8;
                    output2_tm += 8;
                    output3_tm += 8;
                }
                for (; i + 3 < tiles; i += 4)
                {
                    const float* r0 = bb2.row(i / 8 + (i % 8) / 4);

                    const float* kptr = kernel01_tm.row(r);

                    int nn = inch * 4; // inch always > 0

                    __m128 _sum0 = _mm_setzero_ps();
                    __m128 _sum1 = _mm_setzero_ps();
                    __m128 _sum2 = _mm_setzero_ps();
                    __m128 _sum3 = _mm_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m128 _val0 = _mm_load_ps(r0);

                        __m128 _w0 = _mm_load1_ps(kptr);
                        __m128 _w1 = _mm_load1_ps(kptr + 1);
                        __m128 _w2 = _mm_load1_ps(kptr + 2);
                        __m128 _w3 = _mm_load1_ps(kptr + 3);

                        _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);
                        _sum1 = _mm_comp_fmadd_ps(_val0, _w1, _sum1);
                        _sum2 = _mm_comp_fmadd_ps(_val0, _w2, _sum2);
                        _sum3 = _mm_comp_fmadd_ps(_val0, _w3, _sum3);

                        r0 += 4;
                        kptr += 4;
                    }

                    _mm_storeu_ps(output0_tm, _sum0);
                    _mm_storeu_ps(output1_tm, _sum1);
                    _mm_storeu_ps(output2_tm, _sum2);
                    _mm_storeu_ps(output3_tm, _sum3);

                    output0_tm += 4;
                    output1_tm += 4;
                    output2_tm += 4;
                    output3_tm += 4;
                }
                for (; i < tiles; i++)
                {
                    const float* r0 = bb2.row(i / 8 + (i % 8) / 4 + i % 4);

                    const float* kptr = kernel01_tm.row(r);

                    int nn = inch * 4; // inch always > 0

                    __m128 _sum = _mm_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m128 _val0 = _mm_load1_ps(r0);
                        __m128 _w0 = _mm_load_ps(kptr);
                        _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);

                        r0 += 1;
                        kptr += 4;
                    }

                    float sum[4];
                    _mm_storeu_ps(sum, _sum);

                    output0_tm[0] = sum[0];
                    output1_tm[0] = sum[1];
                    output2_tm[0] = sum[2];
                    output3_tm[0] = sum[3];

                    output0_tm += 1;
                    output1_tm += 1;
                    output2_tm += 1;
                    output3_tm += 1;
                }
            }
        }

        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = remain_outch_start; p < outch; p++)
        {
            float* output0_tm = top_blob_tm.channel(p);

            const Mat kernel0_tm = kernel_tm.channel(p / 4 + p % 4);

            for (int r = 0; r < 64; r++)
            {
                const Mat bb2 = bottom_blob_tm2.channel(r);

                int i = 0;
                for (; i + 7 < tiles; i += 8)
                {
                    const float* r0 = bb2.row(i / 8);

                    const float* kptr = kernel0_tm.row(r);

                    int nn = inch * 4; // inch always > 0

                    __m128 _sum0 = _mm_setzero_ps();
                    __m128 _sum1 = _mm_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m128 _val0 = _mm_load_ps(r0);
                        __m128 _val1 = _mm_load_ps(r0 + 4);
                        __m128 _w0 = _mm_load1_ps(kptr);
                        _sum0 = _mm_comp_fmadd_ps(_w0, _val0, _sum0);
                        _sum1 = _mm_comp_fmadd_ps(_w0, _val1, _sum1);

                        r0 += 8;
                        kptr += 1;
                    }

                    _mm_storeu_ps(output0_tm, _sum0);
                    _mm_storeu_ps(output0_tm + 4, _sum1);

                    output0_tm += 8;
                }
                for (; i + 3 < tiles; i += 4)
                {
                    const float* r0 = bb2.row(i / 8 + (i % 8) / 4);

                    const float* kptr = kernel0_tm.row(r);

                    int nn = inch * 4; // inch always > 0

                    __m128 _sum0 = _mm_setzero_ps();

                    for (int j = 0; j < nn; j++)
                    {
                        __m128 _val0 = _mm_load_ps(r0);
                        __m128 _w0 = _mm_load1_ps(kptr);
                        _sum0 = _mm_comp_fmadd_ps(_w0, _val0, _sum0);

                        r0 += 4;
                        kptr += 1;
                    }

                    _mm_storeu_ps(output0_tm, _sum0);

                    output0_tm += 4;
                }
                for (; i < tiles; i++)
                {
                    const float* r0 = bb2.row(i / 8 + (i % 8) / 4 + i % 4);

                    const float* kptr = kernel0_tm.row(r);

                    __m128 _sum0 = _mm_setzero_ps();

                    for (int q = 0; q < inch; q++)
                    {
                        __m128 _val0 = _mm_load_ps(r0);
                        __m128 _w0 = _mm_load_ps(kptr);
                        _sum0 = _mm_comp_fmadd_ps(_val0, _w0, _sum0);

                        r0 += 4;
                        kptr += 4;
                    }

                    float sum0 = _mm_reduce_add_ps(_sum0);

                    output0_tm[0] = sum0;

                    output0_tm++;
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, 4u, 1, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd63_transform_output_sse(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}